

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::GLMRegressor::ByteSizeLong(GLMRegressor *this)

{
  long lVar1;
  Rep *pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  void **ppvVar10;
  
  lVar9 = (long)(this->weights_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (lVar9 == 0) {
    lVar9 = 0;
  }
  else {
    lVar1 = lVar9 * 8;
    lVar8 = 0;
    do {
      sVar5 = GLMRegressor_DoubleArray::ByteSizeLong
                        (*(GLMRegressor_DoubleArray **)((long)ppvVar10 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar1 - lVar8 != 0);
  }
  uVar6 = (ulong)(uint)(this->offset_).current_size_;
  if (uVar6 != 0) {
    uVar7 = ((long)(uVar6 << 0x23) >> 0x20) + 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    lVar9 = lVar9 + (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = lVar9 + uVar6 * 8;
  if ((long)this->postevaluationtransform_ != 0) {
    uVar6 = (long)this->postevaluationtransform_ | 1;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar9 * 9 + 0x49U >> 6) + 1;
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t GLMRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  total_size += 1UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated double offset = 2;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_offset_size());
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->_internal_postevaluationtransform() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_postevaluationtransform());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}